

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O0

void scale_cols(Runtime *rt)

{
  value_type vVar1;
  ulong uVar2;
  mapped_type_conflict1 *pmVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RDI;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double factor2;
  HighsInt var2;
  HighsInt index_3;
  double factor1;
  HighsInt var1;
  HighsInt index_2;
  double factor;
  HighsInt var_3;
  HighsInt var_2;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> factorpervar;
  HighsInt index_1;
  HighsInt index;
  HighsInt var_1;
  HighsInt var;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefpervar;
  double in_stack_fffffffffffffea0;
  key_type_conflict1 *in_stack_fffffffffffffed8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_fffffffffffffee0;
  int local_ac;
  int local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  int local_58;
  int local_54;
  int local_50;
  int local_3c;
  
  if ((*(byte *)(in_RDI + 0x8d1) & 1) != 0) {
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x765a72);
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x404); local_3c = local_3c + 1) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      *pmVar3 = 0.0;
    }
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x404); local_50 = local_50 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),(long)local_50);
      for (local_54 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),
                              (long)(local_50 + 1)), local_54 < *pvVar4; local_54 = local_54 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                            (long)local_54);
        dVar6 = (double)((ulong)*pvVar5 & (ulong)DAT_008704e0);
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (*pmVar3 <= dVar6 && dVar6 != *pmVar3) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                              (long)local_54);
          vVar1 = *pvVar5;
          uVar2 = (ulong)DAT_008704e0;
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          *pmVar3 = (mapped_type_conflict1)((ulong)vVar1 & uVar2);
        }
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),(long)local_50);
      for (local_58 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),
                              (long)(local_50 + 1)), local_58 < *pvVar4; local_58 = local_58 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4c8),(long)local_58);
        if (*pvVar4 == local_50) {
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          dVar6 = *pmVar3;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4e0),
                              (long)local_58);
          dVar7 = sqrt(ABS(*pvVar5));
          uVar8 = SUB84(dVar7,0);
          uVar9 = (int)((ulong)dVar7 >> 0x20);
          if (dVar7 <= dVar6) {
            uVar8 = SUB84(dVar6,0);
            uVar9 = (int)((ulong)dVar6 >> 0x20);
          }
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          *pmVar3 = (mapped_type_conflict1)
                    (~-(ulong)NAN(dVar6) & CONCAT44(uVar9,uVar8) | -(ulong)NAN(dVar6) & (ulong)dVar7
                    );
        }
      }
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x765e21);
    for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x404); local_8c = local_8c + 1) {
      std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
      operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      in_stack_fffffffffffffed8 = (key_type_conflict1 *)largestpoweroftwo(in_stack_fffffffffffffea0)
      ;
      if (128.0 <= (double)in_stack_fffffffffffffed8) {
        in_stack_fffffffffffffed8 = (key_type_conflict1 *)0x4060000000000000;
      }
      in_stack_fffffffffffffee0 =
           (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
           std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      *(key_type_conflict1 **)&(in_stack_fffffffffffffee0->_M_t)._M_impl = in_stack_fffffffffffffed8
      ;
    }
    for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x404); local_90 = local_90 + 1) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      dVar6 = *pmVar3;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),(long)local_90);
      for (local_9c = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),
                              (long)(local_90 + 1)), local_9c < *pvVar4; local_9c = local_9c + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                            (long)local_9c);
        *pvVar5 = *pvVar5 / dVar6;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x438),(long)local_90
                         );
      *pvVar5 = *pvVar5 / dVar6;
    }
    for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x404); local_a0 = local_a0 + 1) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      dVar6 = *pmVar3;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),(long)local_a0);
      for (local_ac = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),
                              (long)(local_a0 + 1)), local_ac < *pvVar4; local_ac = local_ac + 1) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4c8),(long)local_ac);
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        dVar7 = *pmVar3;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4e0),
                            (long)local_ac);
        *pvVar5 = *pvVar5 / (dVar6 * dVar7);
      }
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x76621f);
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x76622c);
  }
  return;
}

Assistant:

static void scale_cols(Runtime& rt) {
  if (!rt.settings.varscaling) {
    return;
  }

  std::map<HighsInt, double> maxabscoefpervar;
  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    maxabscoefpervar[var] = 0.0;
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    // gather information about variable
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      if (fabs(rt.scaled.A.mat.value[index]) > maxabscoefpervar[var]) {
        maxabscoefpervar[var] = fabs(rt.scaled.A.mat.value[index]);
      }
    }

    for (HighsInt index = rt.scaled.Q.mat.start[var];
         index < rt.scaled.Q.mat.start[var + 1]; index++) {
      if (rt.scaled.Q.mat.index[index] == var) {
        maxabscoefpervar[var] = fmax(maxabscoefpervar[var],
                                     sqrt(fabs(rt.scaled.Q.mat.value[index])));
      }
    }
  }

  std::map<HighsInt, double> factorpervar;

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    factorpervar[var] = fmin(128.0, largestpoweroftwo(maxabscoefpervar[var]));
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    // scale variable: constraint matrix
    double factor = factorpervar[var];
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      rt.scaled.A.mat.value[index] /= factor;
    }

    // scale variable: linear objective
    rt.scaled.c.value[var] /= factor;
  }

  // scale variable: hessian matrix
  for (HighsInt var1 = 0; var1 < rt.scaled.num_var; var1++) {
    double factor1 = factorpervar[var1];
    for (HighsInt index = rt.scaled.Q.mat.start[var1];
         index < rt.scaled.Q.mat.start[var1 + 1]; index++) {
      HighsInt var2 = rt.scaled.Q.mat.index[index];
      double factor2 = factorpervar[var2];
      rt.scaled.Q.mat.value[index] /= (factor1 * factor2);
    }
  }
}